

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O0

void __thiscall
SDL2pp::Surface::Blit(Surface *this,Optional<Rect> *srcrect,Surface *dst,Rect *dstrect)

{
  SDL_Surface *pSVar1;
  bool bVar2;
  int iVar3;
  SDL_Surface *pSVar4;
  Exception *this_00;
  value_type *local_58;
  undefined8 local_38;
  SDL_Rect tmpdstrect;
  Rect *dstrect_local;
  Surface *dst_local;
  Optional<Rect> *srcrect_local;
  Surface *this_local;
  
  local_38._0_4_ = (dstrect->super_SDL_Rect).x;
  local_38._4_4_ = (dstrect->super_SDL_Rect).y;
  tmpdstrect.x = (dstrect->super_SDL_Rect).w;
  tmpdstrect.y = (dstrect->super_SDL_Rect).h;
  pSVar1 = this->surface_;
  tmpdstrect._8_8_ = dstrect;
  bVar2 = sdl2pp_libcpp_optional::optional::operator_cast_to_bool((optional *)srcrect);
  if (bVar2) {
    local_58 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(srcrect);
  }
  else {
    local_58 = (value_type *)0x0;
  }
  pSVar4 = Get(dst);
  iVar3 = SDL_UpperBlit(pSVar1,local_58,pSVar4,&local_38);
  if (iVar3 != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x50);
    Exception::Exception(this_00,"SDL_BlitSurface");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void Surface::Blit(const Optional<Rect>& srcrect, Surface& dst, const Rect& dstrect) {
	SDL_Rect tmpdstrect = dstrect; // 4th argument is non-const; does it modify rect?
	if (SDL_BlitSurface(surface_, srcrect ? &*srcrect : nullptr, dst.Get(), &tmpdstrect) != 0)
		throw Exception("SDL_BlitSurface");
}